

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info,string *warn,string *err)

{
  string *psVar1;
  char *__s;
  pointer pTVar2;
  pointer pTVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  EXRChannelInfo *pEVar7;
  int *piVar8;
  EXRAttribute *pEVar9;
  int *piVar10;
  size_t __n;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  stringstream ss;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = (info->display_window).min_y;
  (exr_header->display_window).max_x = (info->display_window).max_x;
  (exr_header->display_window).max_y = (info->display_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = (info->data_window).min_y;
  (exr_header->data_window).max_x = (info->data_window).max_x;
  (exr_header->data_window).max_y = (info->data_window).max_y;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  exr_header->tiled = info->tiled;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = info->tile_size_y;
  exr_header->tile_level_mode = info->tile_level_mode;
  exr_header->tile_rounding_mode = info->tile_rounding_mode;
  if (exr_header != (EXRHeader *)0x0) {
    __s = (info->name)._M_dataplus._M_p;
    memset(exr_header->name,0,0x100);
    if ((__s != (char *)0x0) && (sVar5 = strlen(__s), sVar5 != 0)) {
      __n = 0xff;
      if (sVar5 < 0xff) {
        __n = sVar5;
      }
      memcpy(exr_header->name,__s,__n);
    }
  }
  if ((info->type)._M_string_length != 0) {
    psVar1 = &info->type;
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 == 0) {
      if (exr_header->tiled != 0) goto joined_r0x001061e3;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        iVar4 = exr_header->tiled;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar4 == 0) {
            exr_header->non_image = 1;
            if ((err != (string *)0x0) && (exr_header->tiled != 0)) {
              std::__cxx11::string::append((char *)err);
            }
          }
          else if (warn != (string *)0x0) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"(ConvertHeader) Unsupported or unknown info.type: ",0x32);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,(info->type)._M_dataplus._M_p,
                                (info->type)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)warn,(ulong)local_1d8);
            if (local_1d8 != local_1c8) {
              operator_delete(local_1d8);
            }
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
          }
          goto LAB_0010624b;
        }
        exr_header->non_image = 1;
        iVar4 = exr_header->tiled;
      }
      if (iVar4 == 0) {
joined_r0x001061e3:
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        return false;
      }
    }
  }
LAB_0010624b:
  iVar4 = (int)((long)(info->channels).
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(info->channels).
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  exr_header->num_channels = iVar4;
  pEVar7 = (EXRChannelInfo *)malloc((long)iVar4 * 0x110);
  exr_header->channels = pEVar7;
  uVar11 = (ulong)exr_header->num_channels;
  if (uVar11 != 0) {
    lVar14 = 0;
    lVar12 = 0;
    uVar13 = 0;
    do {
      strncpy(exr_header->channels->name + lVar12,
              *(char **)(((info->channels).
                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pad + lVar14 + -0x31),0xff);
      exr_header->channels->pad[lVar12 + -0xe] = '\0';
      pTVar2 = (info->channels).
               super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar7 = exr_header->channels;
      *(undefined4 *)(pEVar7->pad + lVar12 + -0xd) =
           *(undefined4 *)(pTVar2->pad + lVar14 + 0xffffffffffffffef);
      pEVar7->pad[lVar12 + -1] = pTVar2->pad[lVar14 + 0xffffffffffffffff];
      *(undefined4 *)(pEVar7->pad + lVar12 + -9) =
           *(undefined4 *)(pTVar2->pad + lVar14 + 0xfffffffffffffff7);
      *(undefined4 *)(pEVar7->pad + lVar12 + -5) =
           *(undefined4 *)(pTVar2->pad + lVar14 + 0xfffffffffffffffb);
      uVar13 = uVar13 + 1;
      uVar11 = (ulong)exr_header->num_channels;
      lVar12 = lVar12 + 0x110;
      lVar14 = lVar14 + 0x38;
    } while (uVar13 < uVar11);
  }
  piVar8 = (int *)malloc(uVar11 << 2);
  exr_header->pixel_types = piVar8;
  lVar12 = (long)exr_header->num_channels;
  if (lVar12 != 0) {
    piVar10 = &((info->channels).
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start)->pixel_type;
    lVar14 = 0;
    do {
      piVar8[lVar14] = *piVar10;
      lVar14 = lVar14 + 1;
      piVar10 = piVar10 + 0xe;
    } while (lVar12 != lVar14);
  }
  piVar8 = (int *)malloc(lVar12 << 2);
  exr_header->requested_pixel_types = piVar8;
  iVar4 = exr_header->num_channels;
  if ((long)iVar4 != 0) {
    piVar10 = &((info->channels).
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start)->pixel_type;
    lVar12 = 0;
    do {
      piVar8[lVar12] = *piVar10;
      lVar12 = lVar12 + 1;
      piVar10 = piVar10 + 0xe;
    } while (iVar4 != lVar12);
  }
  iVar4 = (int)((ulong)((long)(info->attributes).
                              super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(info->attributes).
                             super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x3e0f83e1;
  exr_header->num_custom_attributes = iVar4;
  if (iVar4 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < iVar4) {
      exr_header->num_custom_attributes = 0x80;
    }
    iVar4 = exr_header->num_custom_attributes;
    pEVar9 = (EXRAttribute *)malloc((long)iVar4 * 0x210);
    exr_header->custom_attributes = pEVar9;
    if ((long)iVar4 != 0) {
      lVar12 = 0;
      uVar11 = 0;
      do {
        memcpy(exr_header->custom_attributes->name + lVar12,
               ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start)->name + lVar12,0x100);
        memcpy(exr_header->custom_attributes->type + lVar12,
               ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start)->type + lVar12,0x100);
        pTVar3 = (info->attributes).
                 super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar9 = exr_header->custom_attributes;
        *(undefined4 *)((long)&pEVar9->size + lVar12) =
             *(undefined4 *)((long)&pTVar3->size + lVar12);
        *(undefined8 *)((long)&pEVar9->value + lVar12) =
             *(undefined8 *)((long)&pTVar3->value + lVar12);
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x210;
      } while (uVar11 < (ulong)(long)exr_header->num_custom_attributes);
    }
  }
  exr_header->header_len = info->header_len;
  return true;
}

Assistant:

static bool ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info, std::string *warn, std::string *err) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;
  exr_header->tiled = info.tiled;
  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  EXRSetNameAttr(exr_header, info.name.c_str());


  if (!info.type.empty()) {
    bool valid = true;
    if (info.type == "scanlineimage") {
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "tiledimage") {
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deeptile") {
      exr_header->non_image = 1;
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `deeptile` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deepscanline") {
      exr_header->non_image = 1;
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n";
        }
        //valid = false;
      }
    } else {
      if (warn) {
        std::stringstream ss;
        ss << "(ConvertHeader) Unsupported or unknown info.type: " << info.type << "\n";
        (*warn) += ss.str();
      }
    }

    if (!valid) {
      return false;
    }
  }

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < size_t(exr_header->num_custom_attributes); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;

  return true;
}